

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256ByteData_Test::~CryptoUtil_EncryptAes256ByteData_Test
          (CryptoUtil_EncryptAes256ByteData_Test *this)

{
  CryptoUtil_EncryptAes256ByteData_Test *this_local;
  
  ~CryptoUtil_EncryptAes256ByteData_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256ByteData) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data("74657374207465737420746573742074657374");
  ByteData byte_data = CryptoUtil::EncryptAes256(key, data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea");
}